

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManHashProfile(If_DsdMan_t *p)

{
  If_DsdObj_t *pIVar1;
  int local_24;
  int Counter;
  int i;
  uint *pSpot;
  If_DsdObj_t *pObj;
  If_DsdMan_t *p_local;
  
  for (local_24 = 0; local_24 < p->nBins; local_24 = local_24 + 1) {
    _Counter = p->pBins + local_24;
    while (*_Counter != 0) {
      pIVar1 = If_DsdVecObj(&p->vObjs,*_Counter);
      _Counter = (uint *)Vec_IntEntryP(&p->vNexts,pIVar1->Id);
    }
  }
  return;
}

Assistant:

void If_DsdManHashProfile( If_DsdMan_t * p )
{
    If_DsdObj_t * pObj;
    unsigned * pSpot;
    int i, Counter;
    for ( i = 0; i < p->nBins; i++ )
    {
        Counter = 0;
        for ( pSpot = p->pBins + i; *pSpot; pSpot = (unsigned *)Vec_IntEntryP(&p->vNexts, pObj->Id), Counter++ )
             pObj = If_DsdVecObj( &p->vObjs, *pSpot );
//        if ( Counter > 5 )
//            printf( "%d ", Counter );
//        if ( i > 10000 )
//            break;
    }
//    printf( "\n" );
}